

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall TEST_WiningStateTest_OneShot_Test::testBody(TEST_WiningStateTest_OneShot_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long in_stack_fffffffffffffdb8;
  undefined4 uVar8;
  NormalTestTerminator *pNVar6;
  undefined8 uVar7;
  int value;
  NormalTestTerminator local_148;
  NormalTestTerminator local_140;
  SimpleString local_138;
  SimpleString local_130;
  NormalTestTerminator local_128;
  NormalTestTerminator local_120;
  key_type local_114;
  SimpleString local_110;
  SimpleString local_108;
  key_type local_fc [3];
  NormalTestTerminator local_f0;
  NormalTestTerminator local_e8;
  key_type local_dc;
  SimpleString local_d8;
  SimpleString local_d0;
  key_type local_c4 [6];
  key_type local_ac;
  undefined1 local_a8 [8];
  DoublingFactorReport r;
  WinByDiscardSituation local_13;
  TEST_WiningStateTest_OneShot_Test *pTStack_10;
  WinByDiscardSituation situation;
  TEST_WiningStateTest_OneShot_Test *this_local;
  
  pTStack_10 = this;
  TEST_GROUP_CppUTestGroupWiningStateTest::addNoWiningHand
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,false);
  mahjong::PlayerHand::readyHand(&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h);
  mahjong::WinByDiscardSituation::WinByDiscardSituation(&local_13);
  local_13.is_one_shot = true;
  r.doubling_factor._2_1_ = local_13.is_robbing_quad;
  r.doubling_factor._0_1_ = true;
  r.doubling_factor._1_1_ = local_13.is_last_discard;
  TEST_GROUP_CppUTestGroupWiningStateTest::winByDiscard
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,r.doubling_factor._0_3_);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a8,
             &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c);
  local_ac = ReadyHand;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_ac);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_f0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_f0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x83);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1df43e);
  }
  else {
    local_c4[1] = 1;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_c4 + 1);
    local_c4[0] = ReadyHand;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_c4);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                 ,0x83);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffdb8 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_d0);
    local_dc = ReadyHand;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_dc);
    StringFrom(in_stack_fffffffffffffdb8);
    uVar8 = (undefined4)(in_stack_fffffffffffffdb8 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d8);
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e8);
    pNVar6 = (NormalTestTerminator *)CONCAT44(uVar8,0x83);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,pNVar6,&local_e8);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1df352);
    SimpleString::~SimpleString((SimpleString *)0x1df35e);
    SimpleString::~SimpleString((SimpleString *)0x1df36a);
  }
  local_fc[2] = 3;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_fc + 2);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_128.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_128;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x84);
    value = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1df70d);
  }
  else {
    local_fc[1] = 3;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_fc + 1);
    local_fc[0] = OneShot;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_fc);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                 ,0x84);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)((ulong)pNVar6 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_108);
    local_114 = OneShot;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_114);
    StringFrom((unsigned_long)pNVar6);
    uVar8 = (undefined4)((ulong)pNVar6 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_110);
    local_120.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_120);
    uVar7 = CONCAT44(uVar8,0x84);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,uVar7,&local_120);
    value = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1df621);
    SimpleString::~SimpleString((SimpleString *)0x1df62d);
    SimpleString::~SimpleString((SimpleString *)0x1df639);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) {
    pUVar3 = UtestShell::getCurrent();
    local_148.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_148);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x85,&local_148);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1df93a);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_130);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_138);
    local_140.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_140);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,CONCAT44(value,0x85),&local_140);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1df84e);
    SimpleString::~SimpleString((SimpleString *)0x1df85a);
    SimpleString::~SimpleString((SimpleString *)0x1df866);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a8);
  return;
}

Assistant:

TEST(WiningStateTest, OneShot)
{
	addNoWiningHand();
	h.readyHand();

	WinByDiscardSituation situation;
	situation.is_one_shot = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.patterns.count(Pattern::OneShot));
	CHECK_EQUAL(2, r.doubling_factor);
}